

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall Encoder::RecordInlineeFrame(Encoder *this,Func *inlinee,uint32 currentOffset)

{
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  int iVar3;
  undefined4 *puVar4;
  undefined1 local_40 [8];
  NativeOffsetInlineeFramePair pair;
  NativeOffsetInlineeFramePair *lastPair;
  InlineeFrameRecord *record;
  uint32 currentOffset_local;
  Func *inlinee_local;
  Encoder *this_local;
  
  bVar2 = Func::IsLoopBody(this->m_func);
  if (bVar2) {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,InlineInJitLoopBodyPhase,sourceContextId,functionId);
    if (bVar2) {
      return;
    }
  }
  bVar2 = Func::IsSimpleJit(this->m_func);
  if (!bVar2) {
    lastPair = (NativeOffsetInlineeFramePair *)0x0;
    if ((inlinee->frameInfo != (InlineeFrameInfo *)0x0) &&
       (lastPair = (NativeOffsetInlineeFramePair *)inlinee->frameInfo->record,
       (InlineeFrameRecord *)lastPair == (InlineeFrameRecord *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x3f9,"(record != nullptr)","record != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    iVar3 = JsUtil::
            ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>::
            Count(&this->m_inlineeFrameMap->
                   super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                 );
    if (0 < iVar3) {
      this_00 = this->m_inlineeFrameMap;
      iVar3 = JsUtil::
              ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>::
              Count(&this->m_inlineeFrameMap->
                     super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                   );
      pair.record = (InlineeFrameRecord *)
                    JsUtil::
                    List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this_00,iVar3 + -1);
      if (*(InlineeFrameRecord **)&(pair.record)->inlineeStartOffset ==
          (InlineeFrameRecord *)lastPair) {
        (pair.record)->functionOffset = currentOffset;
        return;
      }
    }
    pair._0_8_ = lastPair;
    local_40._0_4_ = currentOffset;
    JsUtil::
    List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this->m_inlineeFrameMap,(NativeOffsetInlineeFramePair *)local_40);
  }
  return;
}

Assistant:

void Encoder::RecordInlineeFrame(Func* inlinee, uint32 currentOffset)
{
    // The only restriction for not supporting loop bodies is that inlinee frame map is created on FunctionEntryPointInfo & not
    // the base class EntryPointInfo.
    if (!(this->m_func->IsLoopBody() && PHASE_OFF(Js::InlineInJitLoopBodyPhase, this->m_func)) && !this->m_func->IsSimpleJit())
    {
        InlineeFrameRecord* record = nullptr;
        if (inlinee->frameInfo)
        {
            record = inlinee->frameInfo->record;
            Assert(record != nullptr);
        }
        if (m_inlineeFrameMap->Count() > 0)
        {
            // update existing record if the entry is the same.
            NativeOffsetInlineeFramePair& lastPair = m_inlineeFrameMap->Item(m_inlineeFrameMap->Count() - 1);

            if (lastPair.record == record)
            {
                lastPair.offset = currentOffset;
                return;
            }
        }
        NativeOffsetInlineeFramePair pair = { currentOffset, record };
        m_inlineeFrameMap->Add(pair);
    }
}